

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmappedfilebuffer.cpp
# Opt level: O0

void __thiscall QMappedFileBuffer::remap(QMappedFileBuffer *this)

{
  QFile *pQVar1;
  QFlags_conflict1 *pQVar2;
  uchar *puVar3;
  QFlags<QFileDevice::MemoryMapFlag> local_1c;
  QFile *local_18;
  QFile *f;
  QMappedFileBuffer *this_local;
  
  f = (QFile *)this;
  local_18 = qobject_cast<QFile*>((QObject *)(this->super_QDeviceBuffer).m_device);
  if (local_18 != (QFile *)0x0) {
    if (this->m_mappeddata != (uchar *)0x0) {
      QFileDevice::unmap((uchar *)local_18);
    }
    pQVar1 = local_18;
    pQVar2 = (QFlags_conflict1 *)(**(code **)(*(long *)local_18 + 0x80))();
    QFlags<QFileDevice::MemoryMapFlag>::QFlags(&local_1c,NoOptions);
    puVar3 = (uchar *)QFileDevice::map((longlong)pQVar1,0,pQVar2);
    this->m_mappeddata = puVar3;
  }
  return;
}

Assistant:

void QMappedFileBuffer::remap() {
    QFile* f = qobject_cast<QFile*>(m_device);
    if(!f)
        return;

    if(m_mappeddata)
        f->unmap(m_mappeddata);
    m_mappeddata = f->map(0, f->size());
}